

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O0

sx__pool_page *
sx__pool_create_page(sx_pool *pool,sx_alloc *alloc,char *file,char *func,uint32_t line)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  sx__pool_page *psVar4;
  int local_54;
  int i;
  sx__pool_page *page;
  uint8_t *buff;
  int item_sz;
  int capacity;
  uint32_t line_local;
  char *func_local;
  char *file_local;
  sx_alloc *alloc_local;
  sx_pool *pool_local;
  
  iVar1 = pool->capacity;
  iVar2 = pool->item_sz;
  psVar4 = (sx__pool_page *)
           sx__malloc(alloc,((long)iVar2 + 8) * (long)iVar1 + 0x20,0x10,file,func,line);
  if (psVar4 == (sx__pool_page *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
               0x3e);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0x3e,"Out of memory");
    pcVar3 = (code *)swi(3);
    psVar4 = (sx__pool_page *)(*pcVar3)();
    return psVar4;
  }
  psVar4->iter = iVar1;
  psVar4->ptrs = &psVar4[1].ptrs;
  psVar4->buff = (uint8_t *)(&psVar4[1].ptrs + iVar1);
  psVar4->next = (sx__pool_page *)0x0;
  for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
    psVar4->ptrs[(iVar1 - local_54) + -1] = psVar4->buff + (long)local_54 * (long)iVar2;
  }
  memset(psVar4->buff,0,(long)(iVar1 * iVar2));
  return psVar4;
}

Assistant:

SX_INLINE sx__pool_page* sx__pool_create_page(sx_pool* pool, const sx_alloc* alloc, const char* file, const char* func,
                                              uint32_t line)
{
    int capacity = pool->capacity;
    int item_sz = pool->item_sz;

    uint8_t* buff = (uint8_t*)sx__malloc(alloc, 
                                         sizeof(sx__pool_page) + (item_sz + sizeof(void*)) * capacity, 
                                         16, file, func, line);
    if (!buff) {
        sx_out_of_memory();
        return NULL;
    }

    sx__pool_page* page = (sx__pool_page*)buff;
    buff += sizeof(sx__pool_page);
    page->iter = capacity;
    page->ptrs = (void**)buff;
    buff += sizeof(void*) * capacity;
    page->buff = buff;
    page->next = NULL;
    for (int i = 0; i < capacity; i++) {
        page->ptrs[capacity - i - 1] = page->buff + (size_t)i * (size_t)item_sz;
    }
    sx_memset(page->buff, 0x0, capacity * item_sz);

    return page;
}